

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O1

void __thiscall xray_re::xr_surface::load_0(xr_surface *this,xr_reader *r)

{
  uint8_t *puVar1;
  uint32_t *puVar2;
  uint *puVar3;
  
  xr_reader::r_sz(r,&this->m_name);
  xr_reader::r_sz(r,&this->m_eshader);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_cshader,0,(char *)(this->m_cshader)._M_string_length,0x1e8ea5);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_gamemtl,0,(char *)(this->m_gamemtl)._M_string_length,0x1e8ea5);
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 1;
  if (*puVar1 != '\0') {
    this->m_flags = 1;
  }
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  this->m_fvf = *puVar2;
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  if (*puVar3 < 2) {
    xr_reader::r_sz(r,&this->m_texture);
    xr_reader::r_sz(r,&this->m_vmap);
    return;
  }
  __assert_fail("tc <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_surface.cxx"
                ,0x38,"void xray_re::xr_surface::load_0(xr_reader &)");
}

Assistant:

void xr_surface::load_0(xr_reader& r)
{
	r.r_sz(m_name);
	r.r_sz(m_eshader);
	m_cshader = "default";
	m_gamemtl = "default";
	if (r.r_bool())
		m_flags = ESF_TWO_SIDED;
	m_fvf = r.r_u32();
	unsigned tc = r.r_u32();
	xr_assert(tc <= 1);
	r.r_sz(m_texture);
	r.r_sz(m_vmap);
}